

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O0

qsizetype QtPrivate::findByteArray(QByteArrayView haystack,qsizetype from,char needle)

{
  qsizetype qVar1;
  longlong *plVar2;
  const_pointer pvVar3;
  void *pvVar4;
  char in_CL;
  long in_RDX;
  long in_FS_OFFSET;
  char *n;
  char *b;
  long local_38;
  long local_30;
  longlong local_28;
  long local_20;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = in_RDX;
  if (in_RDX < 0) {
    qVar1 = QByteArrayView::size(&local_18);
    local_20 = in_RDX + qVar1;
    local_28 = 0;
    plVar2 = qMax<long_long>(&local_20,&local_28);
    local_38 = *plVar2;
  }
  qVar1 = QByteArrayView::size(&local_18);
  if (local_38 < qVar1) {
    pvVar3 = QByteArrayView::data(&local_18);
    qVar1 = QByteArrayView::size(&local_18);
    pvVar4 = memchr(pvVar3 + local_38,(int)in_CL,qVar1 - local_38);
    if (pvVar4 != (void *)0x0) {
      local_30 = (long)pvVar4 - (long)pvVar3;
      goto LAB_0014739b;
    }
  }
  local_30 = -1;
LAB_0014739b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

qsizetype QtPrivate::findByteArray(QByteArrayView haystack, qsizetype from, char needle) noexcept
{
    if (from < 0)
        from = qMax(from + haystack.size(), qsizetype(0));
    if (from < haystack.size()) {
        const char *const b = haystack.data();
        if (const auto n = static_cast<const char *>(
                    memchr(b + from, needle, static_cast<size_t>(haystack.size() - from)))) {
            return n - b;
        }
    }
    return -1;
}